

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_http.c
# Opt level: O2

int nghttp2_http_on_request_headers(nghttp2_stream *stream,nghttp2_frame *frame)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = stream->http_flags;
  if ((uVar1 & 0x8080) == 0x80) {
    if ((uVar1 & 0xb) != 1) {
      return -1;
    }
    stream->content_length = -1;
  }
  else {
    uVar2 = ~uVar1;
    if ((uVar1 & 0x11) == 0 || (uVar2 & 0xe) != 0) {
      return -1;
    }
    if ((short)uVar1 < 0 && (uVar2 & 0x81) != 0) {
      return -1;
    }
    if ((uVar1 & 0x2800) == 0x2000 && (uVar2 & 0x1200) != 0) {
      return -1;
    }
  }
  if ((frame->hd).type != '\x05') {
    return 0;
  }
  stream->http_flags = uVar1 & 0x780;
  stream->content_length = -1;
  return 0;
}

Assistant:

int nghttp2_http_on_request_headers(nghttp2_stream *stream,
                                    nghttp2_frame *frame) {
  if (!(stream->http_flags & NGHTTP2_HTTP_FLAG__PROTOCOL) &&
      (stream->http_flags & NGHTTP2_HTTP_FLAG_METH_CONNECT)) {
    if ((stream->http_flags &
         (NGHTTP2_HTTP_FLAG__SCHEME | NGHTTP2_HTTP_FLAG__PATH)) ||
        (stream->http_flags & NGHTTP2_HTTP_FLAG__AUTHORITY) == 0) {
      return -1;
    }
    stream->content_length = -1;
  } else {
    if ((stream->http_flags & NGHTTP2_HTTP_FLAG_REQ_HEADERS) !=
            NGHTTP2_HTTP_FLAG_REQ_HEADERS ||
        (stream->http_flags &
         (NGHTTP2_HTTP_FLAG__AUTHORITY | NGHTTP2_HTTP_FLAG_HOST)) == 0) {
      return -1;
    }
    if ((stream->http_flags & NGHTTP2_HTTP_FLAG__PROTOCOL) &&
        ((stream->http_flags & NGHTTP2_HTTP_FLAG_METH_CONNECT) == 0 ||
         (stream->http_flags & NGHTTP2_HTTP_FLAG__AUTHORITY) == 0)) {
      return -1;
    }
    if (!check_path(stream)) {
      return -1;
    }
  }

  if (frame->hd.type == NGHTTP2_PUSH_PROMISE) {
    /* we are going to reuse data fields for upcoming response.  Clear
       them now, except for method flags. */
    stream->http_flags &= NGHTTP2_HTTP_FLAG_METH_ALL;
    stream->content_length = -1;
  }

  return 0;
}